

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O1

void __thiscall
vera::QuiltProperties::QuiltProperties
          (QuiltProperties *this,int _width,int _height,int _cols,int _rows)

{
  this->width = _width;
  this->height = _height;
  this->columns = _cols;
  this->rows = _rows;
  this->totalViews = _rows * _cols;
  return;
}

Assistant:

QuiltProperties::QuiltProperties(int _width, int _height, int _cols, int _rows) {
    width = _width;
    height = _height;
    columns = _cols;
    rows = _rows;
    totalViews = _cols * _rows;
}